

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_manager.cpp
# Opt level: O2

void miniros::getPid(XmlRpcValue *params,XmlRpcValue *result)

{
  __pid_t response;
  allocator<char> local_41;
  XmlRpcValue local_40;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"",&local_41);
  response = getpid();
  xmlrpc::responseInt((xmlrpc *)&local_40,1,&local_30,response);
  XmlRpc::XmlRpcValue::operator=(result,&local_40);
  XmlRpc::XmlRpcValue::~XmlRpcValue(&local_40);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void getPid(const XmlRpcValue& params, XmlRpcValue& result)
{
  (void)params;
  result = xmlrpc::responseInt(1, "", (int)getpid());
}